

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O2

result_type_conflict
time_plain<boost::random::mersenne_twister_engine<unsigned_int,32ul,351ul,175ul,19ul,3433795303u,11ul,4294967295u,7ul,834054912u,15ul,4293197824u,17ul,1812433253u>>
          (mersenne_twister_engine<unsigned_int,_32UL,_351UL,_175UL,_19UL,_3433795303U,_11UL,_4294967295U,_7UL,_834054912U,_15UL,_4293197824U,_17UL,_1812433253U>
           *r)

{
  result_type_conflict rVar1;
  result_type_conflict rVar2;
  time_t *in_RSI;
  long lVar3;
  bool bVar4;
  double extraout_XMM0_Qa;
  timer T;
  string res;
  double local_28;
  
  T._resolution = 1e-06;
  T._t.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  rVar2 = 0;
  lVar3 = 0x1000000;
  while (bVar4 = lVar3 != 0, lVar3 = lVar3 + -1, bVar4) {
    rVar1 = boost::random::
            mersenne_twister_engine<unsigned_int,_32UL,_351UL,_175UL,_19UL,_3433795303U,_11UL,_4294967295U,_7UL,_834054912U,_15UL,_4293197824U,_17UL,_1812433253U>
            ::operator()(r);
    rVar2 = rVar2 + rVar1;
  }
  timer::time(&T,in_RSI);
  local_28 = 16.777216 / extraout_XMM0_Qa;
  to_string<double>(&res,&local_28);
  while (res._M_string_length < 10) {
    std::__cxx11::string::push_back((char)&res);
  }
  std::operator<<((ostream *)&std::cout,(string *)&res);
  std::__cxx11::string::~string((string *)&res);
  return rVar2;
}

Assistant:

typename R::result_type time_plain(R &r) {
  typename R::result_type s{0};
  timer T;
  long max(1l << 24);
  for (long i{0}; i < max; ++i)
    s += r();
  std::string res(to_string(1e-6 * max / T.time()));
  while (res.length() < 10)
    res += ' ';
  std::cout << res;
  return s;
}